

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
* __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *this)

{
  bool bVar1;
  reference pcVar2;
  pointer pvVar3;
  size_type __maxlen;
  long in_RSI;
  undefined1 local_48 [8];
  array<char,_9UL> cs;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  __end3 = std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x30));
  register0x00000000 =
       std::vector<char,_std::allocator<char>_>::end
                 ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x30));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)(cs._M_elems + 8)), bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end3);
    cs._M_elems[7] = *pcVar2;
    if ((cs._M_elems[7] < '\0') || ('\x1f' < cs._M_elems[7])) {
      std::__cxx11::string::push_back((char)this);
    }
    else {
      cs._M_elems[0] = '\0';
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      pvVar3 = std::array<char,_9UL>::data((array<char,_9UL> *)local_48);
      __maxlen = std::array<char,_9UL>::size((array<char,_9UL> *)local_48);
      snprintf(pvVar3,__maxlen,"<U+%.4X>",(ulong)(byte)cs._M_elems[7]);
      pvVar3 = std::array<char,_9UL>::data((array<char,_9UL> *)local_48);
      std::__cxx11::string::operator+=((string *)this,pvVar3);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&__end3);
  }
  return this;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if ('\x00' <= c and c <= '\x1F')
            {
                // escape control characters
                std::array<char, 9> cs{{}};
                (std::snprintf)(cs.data(), cs.size(), "<U+%.4X>", static_cast<unsigned char>(c));
                result += cs.data();
            }
            else
            {
                // add character as is
                result.push_back(c);
            }
        }

        return result;
    }